

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_line_container_test.cpp
# Opt level: O3

void queryTest(int absBound)

{
  pointer *this;
  bool bVar1;
  int iVar2;
  Line *l;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  ll lVar4;
  long lVar5;
  long x;
  char *message;
  int iVar6;
  Line *__args;
  long lhs;
  undefined1 local_b8 [8];
  LineContainer lc;
  vector<Line,_std::allocator<Line>_> linesToAdd;
  internal local_68 [8];
  AssertionResult gtest_ar;
  vector<Line,_std::allocator<Line>_> lines;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._12_8_ = 0;
  local_b8 = (undefined1  [8])0x0;
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  lc.super_vector<Line,_std::allocator<Line>_>.super__Vector_base<Line,_std::allocator<Line>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  genLines((vector<Line,_std::allocator<Line>_> *)&lc.qi,100,-absBound,absBound,-absBound,absBound);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  sortLines((vector<Line,_std::allocator<Line>_> *)&lc.qi);
  if ((pointer)lc._24_8_ !=
      linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    this = &linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    __args = (Line *)lc._24_8_;
    do {
      if (lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        std::vector<Line,std::allocator<Line>>::_M_realloc_insert<Line_const&>
                  ((vector<Line,std::allocator<Line>> *)&gtest_ar.message_,(iterator)0x0,__args);
      }
      else {
        (lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
        _M_start)->p = __args->p;
        lVar4 = __args->m;
        (lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
        _M_start)->k = __args->k;
        (lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
        _M_start)->m = lVar4;
        lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
        _M_start = lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      LineContainer::add((LineContainer *)local_b8,__args->k,__args->m);
      iVar6 = 0;
      do {
        iVar2 = rand();
        x = (long)(iVar2 % 2000 + -1000);
        lhs = -100000000000000000;
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          lhs = -100000000000000000;
          sVar3 = gtest_ar.message_;
          do {
            lVar5 = (long)((sVar3.ptr_)->_M_dataplus)._M_p * x + (sVar3.ptr_)->_M_string_length;
            if (lhs <= lVar5) {
              lhs = lVar5;
            }
            sVar3.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (((sVar3.ptr_)->field_2)._M_local_buf + 8);
          } while (sVar3.ptr_ !=
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   lines.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                   super__Vector_impl_data._M_start);
        }
        lVar4 = LineContainer::query((LineContainer *)local_b8,x);
        testing::internal::CmpHelperEQ(local_68,"naiveQuery(lines, x)","lc.query(x)",lhs,lVar4);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          message = "";
          if (gtest_ar._0_8_ != 0) {
            message = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/data-structures/fast_line_container_test.cpp"
                     ,0x2a,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)this,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this);
          if (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_38.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_38.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 10);
      __args = __args + 1;
    } while (__args != linesToAdd.super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (lc._24_8_ != 0) {
    operator_delete((void *)lc._24_8_);
  }
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8);
  }
  return;
}

Assistant:

void queryTest(int absBound) {
    LineContainer lc;
    vector<Line> linesToAdd = genLines(100, -absBound,absBound,-absBound,absBound),
                 lines;
    
    sortLines(linesToAdd);
    for(auto & l : linesToAdd) {
        lines.push_back(l);
        lc.add(l.k, l.m);
        rep(qit, 0, 10) {
            int x = randrange(-1000, 1000);
            EXPECT_EQ(naiveQuery(lines, x), lc.query(x));
        }
    }
}